

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

PFN_vkVoidFunction VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance,char *pName)

{
  ulong uVar1;
  long *plVar2;
  int iVar3;
  PFN_vkVoidFunction p_Var4;
  PFN_vkVoidFunction p_Var5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  Instance *instance_00;
  
  if (pName != (char *)0x0) {
    lVar8 = 0;
    do {
      iVar3 = strcmp(*(char **)((long)&Fossilize::interceptCoreInstanceCommand(char_const*)::
                                       coreInstanceCommands + lVar8),pName);
      if (iVar3 == 0) {
        p_Var4 = *(PFN_vkVoidFunction *)((long)&PTR_CreateInstance_00176868 + lVar8);
        goto LAB_00114a01;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    p_Var4 = (PFN_vkVoidFunction)0x0;
LAB_00114a01:
    if (p_Var4 != (PFN_vkVoidFunction)0x0) {
      return p_Var4;
    }
    if (instance != (VkInstance)0x0) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)Fossilize::globalLock);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      uVar1 = *(ulong *)instance;
      plVar6 = *(long **)(Fossilize::instanceData + (uVar1 % DAT_00177710) * 8);
      plVar7 = (long *)0x0;
      if ((plVar6 != (long *)0x0) &&
         (plVar2 = (long *)*plVar6, plVar7 = plVar6, ((long *)*plVar6)[1] != uVar1)) {
        while (plVar6 = plVar2, plVar2 = (long *)*plVar6, plVar2 != (long *)0x0) {
          plVar7 = (long *)0x0;
          if (((ulong)plVar2[1] % DAT_00177710 != uVar1 % DAT_00177710) ||
             (plVar7 = plVar6, plVar2[1] == uVar1)) goto LAB_00114a97;
        }
        plVar7 = (long *)0x0;
      }
LAB_00114a97:
      if (plVar7 == (long *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = *plVar7;
      }
      if (lVar8 == 0) {
        instance_00 = (Instance *)0x0;
      }
      else {
        instance_00 = *(Instance **)(lVar8 + 0x10);
      }
      pthread_mutex_unlock((pthread_mutex_t *)Fossilize::globalLock);
      p_Var4 = (*instance_00->gpa)(instance_00->instance,pName);
      if (p_Var4 != (PFN_vkVoidFunction)0x0) {
        lVar8 = 0;
        do {
          iVar3 = strcmp(*(char **)((long)&Fossilize::interceptInstanceCommand(char_const*)::
                                           instanceCommands + lVar8),pName);
          if (iVar3 == 0) {
            p_Var5 = *(PFN_vkVoidFunction *)
                      ((long)&PTR_GetPhysicalDeviceProperties2_001768a8 + lVar8);
            goto LAB_00114b00;
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x20);
        p_Var5 = (PFN_vkVoidFunction)0x0;
LAB_00114b00:
        if (p_Var5 != (PFN_vkVoidFunction)0x0) {
          return p_Var5;
        }
      }
      if (p_Var4 == (PFN_vkVoidFunction)0x0) {
        return (PFN_vkVoidFunction)0x0;
      }
      p_Var5 = Fossilize::interceptDeviceCommand(instance_00,pName);
      if (p_Var5 == (PFN_vkVoidFunction)0x0) {
        return p_Var4;
      }
      return p_Var5;
    }
  }
  return (PFN_vkVoidFunction)0x0;
}

Assistant:

VK_LAYER_EXPORT VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance, const char *pName)
{
	if (!pName)
		return nullptr;

	// We only wrap core Vulkan 1.0 instance commands, no need to check for availability of underlying implementation.
	auto proc = interceptCoreInstanceCommand(pName);
	if (proc)
		return proc;

	// For global instance functions, the assumption is that we cannot call down the chain.
	if (!instance)
		return nullptr;

	Instance *layer;
	{
		lock_guard<mutex> holder{globalLock};
		layer = getLayerData(getDispatchKey(instance), instanceData);
	}

	proc = layer->getProcAddr(pName);

	if (proc)
	{
		auto wrapped_proc = interceptInstanceCommand(pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	// If the underlying implementation returns nullptr, we also need to return nullptr.
	// This means we never expose wrappers which will end up dispatching into nullptr.
	if (proc)
	{
		auto wrapped_proc = interceptDeviceCommand(layer, pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	return proc;
}